

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> * __thiscall
Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::RefIterator::next(RefIterator *this)

{
  RefIterator *this_local;
  
  this->_pointer = this->_pointer + -1;
  return this->_pointer;
}

Assistant:

inline
    C& next()
    {
      ASS(_pointer > _stack._stack);
      ASS(_last == 2);
#if VDEBUG
      _last = 1;
#endif

      _pointer--;
      return *_pointer;
    }